

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValuesInParamsGenerator<double>::iuValuesInParamsGenerator<double,1ul>
          (iuValuesInParamsGenerator<double> *this,double (*values) [1])

{
  params_t *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  const_iterator local_20;
  double (*local_18) [1];
  double (*values_local) [1];
  iuValuesInParamsGenerator<double> *this_local;
  
  local_18 = values;
  values_local = (double (*) [1])this;
  iuIParamGenerator<double>::iuIParamGenerator((iuIParamGenerator<double> *)this);
  (this->super_iuIParamGenerator<std::tuple<bool,_int,_int>_>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_00622f10;
  this_00 = &this->m_values;
  std::vector<double,_std::allocator<double>_>::vector(this_00);
  __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&this->m_it);
  local_28._M_current = (double *)std::vector<double,_std::allocator<double>_>::end(this_00);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_20,&local_28);
  std::vector<double,std::allocator<double>>::insert<double_const*,void>
            ((vector<double,std::allocator<double>> *)this_00,local_20,*local_18,local_18[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }